

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenTrySetCatchTagAt(BinaryenExpressionRef expr,BinaryenIndex index,char *catchTag)

{
  uintptr_t uVar1;
  IString *this;
  undefined1 in_CL;
  ulong uVar2;
  string_view sVar3;
  
  if (expr->_id != TryId) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe7e,
                  "void BinaryenTrySetCatchTagAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  uVar2 = (ulong)index;
  if (*(ulong *)(expr + 3) <= uVar2) {
    __assert_fail("index < static_cast<Try*>(expression)->catchTags.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe7f,
                  "void BinaryenTrySetCatchTagAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  if (catchTag == (char *)0x0) {
    __assert_fail("catchTag",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe80,
                  "void BinaryenTrySetCatchTagAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  this = (IString *)strlen(catchTag);
  sVar3._M_str = (char *)0x0;
  sVar3._M_len = (size_t)catchTag;
  sVar3 = wasm::IString::interned(this,sVar3,(bool)in_CL);
  if (uVar2 < *(ulong *)(expr + 3)) {
    uVar1 = expr[2].type.id;
    *(size_t *)(uVar1 + uVar2 * 0x10) = sVar3._M_len;
    *(char **)(uVar1 + 8 + uVar2 * 0x10) = sVar3._M_str;
    return;
  }
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0xbc,
                "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
               );
}

Assistant:

void BinaryenTrySetCatchTagAt(BinaryenExpressionRef expr,
                              BinaryenIndex index,
                              const char* catchTag) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(index < static_cast<Try*>(expression)->catchTags.size());
  assert(catchTag);
  static_cast<Try*>(expression)->catchTags[index] = catchTag;
}